

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O1

void __thiscall CEditor::DoQuad(CEditor *this,CQuad *q,int Index)

{
  CPoint *pCVar1;
  CPoint *pCVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int v;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  byte bVar12;
  long lVar13;
  long in_FS_OFFSET;
  float fVar14;
  float fVar15;
  float fVar18;
  CPoint CVar16;
  undefined1 auVar17 [16];
  ulong uVar19;
  CPoint CVar20;
  undefined1 auVar21 [16];
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined8 local_48;
  float local_40;
  float local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar1 = q->m_aPoints + 4;
  uVar3 = (this->m_UI).m_MouseWorldX;
  uVar4 = (this->m_UI).m_MouseWorldY;
  fVar14 = (float)q->m_aPoints[4].x * 0.0009765625;
  fVar18 = (float)q->m_aPoints[4].y * 0.0009765625;
  fVar22 = (fVar14 - (float)uVar3) / this->m_WorldZoom;
  fVar15 = (fVar18 - (float)uVar4) / this->m_WorldZoom;
  if (fVar22 * fVar22 + fVar15 * fVar15 < 50.0) {
    (this->m_UI).m_pBecommingHotItem = pCVar1;
  }
  iVar8 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])(this->m_pInput,0x162);
  bVar12 = 1;
  if ((char)iVar8 == '\0') {
    iVar8 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])(this->m_pInput,0x166);
    bVar12 = (byte)iVar8;
  }
  if (this->m_SelectedQuad == Index) {
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])();
    local_40 = this->m_WorldZoom * 7.0;
    local_48 = CONCAT44(fVar18,fVar14);
    local_3c = local_40;
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1c])(this->m_pGraphics,&local_48,1);
  }
  if ((CPoint *)(this->m_UI).m_pActiveItem == pCVar1) {
    (this->m_UI).m_ActiveItemValid = true;
    if (0.5 < this->m_MouseDeltaWx * this->m_MouseDeltaWx +
              this->m_MouseDeltaWy * this->m_MouseDeltaWy) {
      if (DoQuad::s_Operation == 1) {
        if ((byte)(bVar12 | this->m_GridActive ^ 1U) == 1) {
          lVar13 = 0;
          do {
            CVar20.x = q->m_aPoints[lVar13].x + (int)(((float)uVar3 - DoQuad::s_LastWx) * 1024.0);
            CVar20.y = q->m_aPoints[lVar13].y + (int)(((float)uVar4 - DoQuad::s_LastWy) * 1024.0);
            q->m_aPoints[lVar13] = CVar20;
            lVar13 = lVar13 + 1;
          } while (lVar13 != 5);
        }
        else {
          iVar8 = this->m_ZoomLevel;
          uVar10 = 0x10;
          if ((((100 < iVar8) && (uVar10 = 0x20, 0xfa < iVar8)) && (uVar10 = 0x40, 0x1c2 < iVar8))
             && (uVar10 = 0x80, 0x352 < iVar8)) {
            uVar10 = (uint)(0x60e < iVar8) * 0x100 + 0x100;
          }
          fVar15 = (float)(int)(this->m_GridFactor * (uVar10 >> 1));
          fVar22 = (float)(int)((uVar10 >> 1) * this->m_GridFactor);
          auVar24._0_4_ =
               (float)((uint)-fVar15 & -(uint)((float)uVar3 < 0.0) |
                      ~-(uint)((float)uVar3 < 0.0) & (uint)fVar15) + (float)uVar3;
          auVar24._4_4_ =
               (float)((uint)-fVar22 & -(uint)((float)uVar4 < 0.0) |
                      ~-(uint)((float)uVar4 < 0.0) & (uint)fVar22) + (float)uVar4;
          auVar24._8_8_ = 0;
          iVar8 = this->m_GridFactor * uVar10;
          iVar11 = this->m_GridFactor * uVar10;
          auVar25._0_4_ = (float)iVar8;
          auVar25._4_4_ = (float)iVar11;
          auVar25._8_8_ = 0;
          auVar25 = divps(auVar24,auVar25);
          CVar16.x = (int)((float)(iVar8 * (int)auVar25._0_4_) * 1024.0);
          CVar16.y = (int)((float)((int)auVar25._4_4_ * iVar11) * 1024.0);
          iVar8 = CVar16.y - q->m_aPoints[4].y;
          iVar11 = CVar16.x - q->m_aPoints[4].x;
          q->m_aPoints[4] = CVar16;
          lVar13 = 0;
          do {
            pCVar1 = q->m_aPoints + lVar13;
            iVar5 = pCVar1->y;
            iVar6 = pCVar1[1].x;
            iVar7 = pCVar1[1].y;
            pCVar2 = q->m_aPoints + lVar13;
            pCVar2->x = pCVar1->x + iVar11;
            pCVar2->y = iVar5 + iVar8;
            pCVar2[1].x = iVar6 + iVar11;
            pCVar2[1].y = iVar7 + iVar8;
            lVar13 = lVar13 + 2;
          } while (lVar13 != 4);
        }
      }
      else if (DoQuad::s_Operation == 2) {
        if (bVar12 == 0 && this->m_GridActive == true) {
          iVar8 = this->m_ZoomLevel;
          uVar10 = 0x10;
          if (((100 < iVar8) && (uVar10 = 0x20, 0xfa < iVar8)) &&
             ((uVar10 = 0x40, 0x1c2 < iVar8 && (uVar10 = 0x80, 0x352 < iVar8)))) {
            uVar10 = (uint)(0x60e < iVar8) * 0x100 + 0x100;
          }
          fVar15 = (float)(int)((uVar10 >> 1) * this->m_GridFactor);
          iVar8 = this->m_GridFactor * uVar10;
          pCVar1->x = (int)((float)((int)(((float)(-(uint)((float)uVar3 < 0.0) & (uint)-fVar15 |
                                                  ~-(uint)((float)uVar3 < 0.0) & (uint)fVar15) +
                                          (float)uVar3) / (float)iVar8) * iVar8) * 1024.0);
          iVar8 = (int)((float)((int)(((float)(-(uint)((float)uVar4 < 0.0) & (uint)-fVar15 |
                                              ~-(uint)((float)uVar4 < 0.0) & (uint)fVar15) +
                                      (float)uVar4) / (float)iVar8) * iVar8) * 1024.0);
        }
        else {
          q->m_aPoints[4].x = q->m_aPoints[4].x + (int)(((float)uVar3 - DoQuad::s_LastWx) * 1024.0);
          iVar8 = (int)(((float)uVar4 - DoQuad::s_LastWy) * 1024.0) + q->m_aPoints[4].y;
        }
        q->m_aPoints[4].y = iVar8;
      }
      else if (DoQuad::s_Operation == 3) {
        lVar13 = 0;
        do {
          *(undefined8 *)((long)&q->m_aPoints[0].x + lVar13) =
               *(undefined8 *)((long)&DoQuad::s_RotatePoints[0].x + lVar13);
          Rotate(pCVar1,(CPoint *)((long)&q->m_aPoints[0].x + lVar13),DoQuad::s_RotateAngle);
          lVar13 = lVar13 + 8;
        } while (lVar13 != 0x20);
      }
    }
    DoQuad::s_RotateAngle = this->m_MouseDeltaX * 0.002 + DoQuad::s_RotateAngle;
    uVar10 = (this->m_UI).m_MouseButtons;
    if (DoQuad::s_Operation == 4) {
      DoQuad::s_LastWx = (float)uVar3;
      DoQuad::s_LastWy = (float)uVar4;
      if ((uVar10 & 2) == 0) {
        CUI::DoPopupMenu(&this->m_UI,(int)(this->m_UI).m_MouseX,(int)(this->m_UI).m_MouseY,0x78,0xb4
                         ,this,PopupQuad,0xf);
LAB_001983ed:
        this->m_LockMouse = false;
        DoQuad::s_Operation = 0;
        (this->m_UI).m_ActiveItemValid = true;
        (this->m_UI).m_pActiveItem = (void *)0x0;
      }
    }
    else {
      DoQuad::s_LastWx = (float)uVar3;
      DoQuad::s_LastWy = (float)uVar4;
      if ((uVar10 & 1) == 0) goto LAB_001983ed;
    }
    uVar10 = this->m_pConfig->m_EdColorQuadPivotActive;
  }
  else {
    if ((CPoint *)(this->m_UI).m_pHotItem == pCVar1) {
      uVar10 = this->m_pConfig->m_EdColorQuadPivotHover;
      uVar9 = uVar10 >> 8;
      ms_pUiGotContext = pCVar1;
      this->m_pTooltip =
           "Left mouse button to move. Hold shift to move pivot. Hold ctrl to rotate. Hold alt to ignore grid."
      ;
      if (((this->m_UI).m_MouseButtons & 1) != 0) {
        iVar8 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])(this->m_pInput,0x161);
        if (((char)iVar8 == '\0') &&
           (iVar8 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])(this->m_pInput,0x165),
           (char)iVar8 == '\0')) {
          iVar8 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])(this->m_pInput,0x160);
          if (((char)iVar8 == '\0') &&
             (iVar8 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])
                                (this->m_pInput,0x164), (char)iVar8 == '\0')) {
            DoQuad::s_Operation = 1;
          }
          else {
            this->m_LockMouse = true;
            DoQuad::s_Operation = 3;
            DoQuad::s_RotateAngle = 0.0;
            DoQuad::s_RotatePoints[0] = q->m_aPoints[0];
            DoQuad::s_RotatePoints[1] = q->m_aPoints[1];
            DoQuad::s_RotatePoints[2] = q->m_aPoints[2];
            DoQuad::s_RotatePoints[3] = q->m_aPoints[3];
          }
        }
        else {
          DoQuad::s_Operation = 2;
        }
        (this->m_UI).m_ActiveItemValid = true;
        (this->m_UI).m_pActiveItem = pCVar1;
        (this->m_UI).m_pLastActiveItem = pCVar1;
        if (this->m_SelectedQuad != Index) {
          this->m_SelectedPoints = 0;
        }
        this->m_SelectedQuad = Index;
        DoQuad::s_LastWx = (float)uVar3;
        DoQuad::s_LastWy = (float)uVar4;
      }
      uVar19 = CONCAT44(uVar10 >> 0x10,uVar10 >> 0x18) & 0xffffffffff;
      if (((this->m_UI).m_MouseButtons & 2) != 0) {
        if (this->m_SelectedQuad != Index) {
          this->m_SelectedPoints = 0;
        }
        this->m_SelectedQuad = Index;
        DoQuad::s_Operation = 4;
        (this->m_UI).m_ActiveItemValid = true;
        (this->m_UI).m_pActiveItem = pCVar1;
        (this->m_UI).m_pLastActiveItem = pCVar1;
      }
      goto LAB_0019843f;
    }
    uVar10 = this->m_pConfig->m_EdColorQuadPivot;
  }
  uVar19 = CONCAT44(uVar10 >> 0x10,uVar10 >> 0x18) & 0xffffffffff;
  uVar9 = uVar10 >> 8;
LAB_0019843f:
  auVar21._0_8_ = uVar19 & 0xffffffff;
  auVar21._8_4_ = (int)(uVar19 >> 0x20);
  auVar21._12_4_ = 0;
  auVar17._0_4_ = (float)(SUB168(auVar21 | _DAT_001dfc30,0) - (double)DAT_001dfc30);
  auVar17._4_4_ = (float)(SUB168(auVar21 | _DAT_001dfc30,8) - DAT_001dfc30._8_8_);
  auVar17._8_8_ = 0;
  divps(auVar17,_DAT_001dc020);
  auVar23._0_4_ = (float)(uVar9 & 0xff);
  auVar23._4_4_ = (float)(uVar10 & 0xff);
  auVar23._8_8_ = 0;
  divps(auVar23,_DAT_001dc020);
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])();
  local_40 = this->m_WorldZoom * 5.0;
  local_48 = CONCAT44(fVar18,fVar14);
  local_3c = local_40;
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1c])(this->m_pGraphics,&local_48,1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CEditor::DoQuad(CQuad *q, int Index)
{
	enum
	{
		OP_NONE=0,
		OP_MOVE_ALL,
		OP_MOVE_PIVOT,
		OP_ROTATE,
		OP_CONTEXT_MENU,
	};

	// some basic values
	void *pID = &q->m_aPoints[4]; // use pivot addr as id
	static CPoint s_RotatePoints[4];
	static float s_LastWx;
	static float s_LastWy;
	static int s_Operation = OP_NONE;
	static float s_RotateAngle = 0;
	float wx = UI()->MouseWorldX();
	float wy = UI()->MouseWorldY();

	// get pivot
	float CenterX = fx2f(q->m_aPoints[4].x);
	float CenterY = fx2f(q->m_aPoints[4].y);

	float dx = (CenterX - wx)/m_WorldZoom;
	float dy = (CenterY - wy)/m_WorldZoom;
	if(dx*dx+dy*dy < 50)
		UI()->SetHotItem(pID);

	bool IgnoreGrid;
	if(Input()->KeyIsPressed(KEY_LALT) || Input()->KeyIsPressed(KEY_RALT))
		IgnoreGrid = true;
	else
		IgnoreGrid = false;

	// draw selection background
	if(m_SelectedQuad == Index)
	{
		Graphics()->SetColor(0,0,0,1);
		IGraphics::CQuadItem QuadItem(CenterX, CenterY, 7.0f*m_WorldZoom, 7.0f*m_WorldZoom);
		Graphics()->QuadsDraw(&QuadItem, 1);
	}

	vec4 PivotColor;

	if(UI()->CheckActiveItem(pID))
	{
		if(m_MouseDeltaWx*m_MouseDeltaWx+m_MouseDeltaWy*m_MouseDeltaWy > 0.5f)
		{
			// check if we only should move pivot
			if(s_Operation == OP_MOVE_PIVOT)
			{
				if(m_GridActive && !IgnoreGrid)
				{
					int LineDistance = GetLineDistance();

					float x = 0.0f;
					float y = 0.0f;
					if(wx >= 0)
						x = (int)((wx+(LineDistance/2)*m_GridFactor)/(LineDistance*m_GridFactor)) * (LineDistance*m_GridFactor);
					else
						x = (int)((wx-(LineDistance/2)*m_GridFactor)/(LineDistance*m_GridFactor)) * (LineDistance*m_GridFactor);
					if(wy >= 0)
						y = (int)((wy+(LineDistance/2)*m_GridFactor)/(LineDistance*m_GridFactor)) * (LineDistance*m_GridFactor);
					else
						y = (int)((wy-(LineDistance/2)*m_GridFactor)/(LineDistance*m_GridFactor)) * (LineDistance*m_GridFactor);

					q->m_aPoints[4].x = f2fx(x);
					q->m_aPoints[4].y = f2fx(y);
				}
				else
				{
					q->m_aPoints[4].x += f2fx(wx-s_LastWx);
					q->m_aPoints[4].y += f2fx(wy-s_LastWy);
				}
			}
			else if(s_Operation == OP_MOVE_ALL)
			{
				// move all points including pivot
				if(m_GridActive && !IgnoreGrid)
				{
					int LineDistance = GetLineDistance();

					float x = 0.0f;
					float y = 0.0f;
					if(wx >= 0)
						x = (int)((wx+(LineDistance/2)*m_GridFactor)/(LineDistance*m_GridFactor)) * (LineDistance*m_GridFactor);
					else
						x = (int)((wx-(LineDistance/2)*m_GridFactor)/(LineDistance*m_GridFactor)) * (LineDistance*m_GridFactor);
					if(wy >= 0)
						y = (int)((wy+(LineDistance/2)*m_GridFactor)/(LineDistance*m_GridFactor)) * (LineDistance*m_GridFactor);
					else
						y = (int)((wy-(LineDistance/2)*m_GridFactor)/(LineDistance*m_GridFactor)) * (LineDistance*m_GridFactor);

					int OldX = q->m_aPoints[4].x;
					int OldY = q->m_aPoints[4].y;
					q->m_aPoints[4].x = f2fx(x);
					q->m_aPoints[4].y = f2fx(y);
					int DiffX = q->m_aPoints[4].x - OldX;
					int DiffY = q->m_aPoints[4].y - OldY;

					for(int v = 0; v < 4; v++)
					{
						q->m_aPoints[v].x += DiffX;
						q->m_aPoints[v].y += DiffY;
					}
				}
				else
				{
					for(int v = 0; v < 5; v++)
					{
							q->m_aPoints[v].x += f2fx(wx-s_LastWx);
							q->m_aPoints[v].y += f2fx(wy-s_LastWy);
					}
				}
			}
			else if(s_Operation == OP_ROTATE)
			{
				for(int v = 0; v < 4; v++)
				{
					q->m_aPoints[v] = s_RotatePoints[v];
					Rotate(&q->m_aPoints[4], &q->m_aPoints[v], s_RotateAngle);
				}
			}
		}

		s_RotateAngle += (m_MouseDeltaX) * 0.002f;
		s_LastWx = wx;
		s_LastWy = wy;

		if(s_Operation == OP_CONTEXT_MENU)
		{
			if(!UI()->MouseButton(1))
			{
				UI()->DoPopupMenu(UI()->MouseX(), UI()->MouseY(), 120, 180, this, PopupQuad);
				m_LockMouse = false;
				s_Operation = OP_NONE;
				UI()->SetActiveItem(0);
			}
		}
		else
		{
			if(!UI()->MouseButton(0))
			{
				m_LockMouse = false;
				s_Operation = OP_NONE;
				UI()->SetActiveItem(0);
			}
		}

		PivotColor = HexToRgba(Config()->m_EdColorQuadPivotActive);
	}
	else if(UI()->HotItem() == pID)
	{
		ms_pUiGotContext = pID;

		PivotColor = HexToRgba(Config()->m_EdColorQuadPivotHover);
		m_pTooltip = "Left mouse button to move. Hold shift to move pivot. Hold ctrl to rotate. Hold alt to ignore grid.";

		if(UI()->MouseButton(0))
		{
			if(Input()->KeyIsPressed(KEY_LSHIFT) || Input()->KeyIsPressed(KEY_RSHIFT))
				s_Operation = OP_MOVE_PIVOT;
			else if(Input()->KeyIsPressed(KEY_LCTRL) || Input()->KeyIsPressed(KEY_RCTRL))
			{
				m_LockMouse = true;
				s_Operation = OP_ROTATE;
				s_RotateAngle = 0;
				s_RotatePoints[0] = q->m_aPoints[0];
				s_RotatePoints[1] = q->m_aPoints[1];
				s_RotatePoints[2] = q->m_aPoints[2];
				s_RotatePoints[3] = q->m_aPoints[3];
			}
			else
				s_Operation = OP_MOVE_ALL;

			UI()->SetActiveItem(pID);
			if(m_SelectedQuad != Index)
				m_SelectedPoints = 0;
			m_SelectedQuad = Index;
			s_LastWx = wx;
			s_LastWy = wy;
		}

		if(UI()->MouseButton(1))
		{
			if(m_SelectedQuad != Index)
				m_SelectedPoints = 0;
			m_SelectedQuad = Index;
			s_Operation = OP_CONTEXT_MENU;
			UI()->SetActiveItem(pID);
		}
	}
	else
		PivotColor = HexToRgba(Config()->m_EdColorQuadPivot);

	Graphics()->SetColor(PivotColor.r, PivotColor.g, PivotColor.b, PivotColor.a);
	IGraphics::CQuadItem QuadItem(CenterX, CenterY, 5.0f*m_WorldZoom, 5.0f*m_WorldZoom);
	Graphics()->QuadsDraw(&QuadItem, 1);
}